

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printBreak(JSPrinter *this,Ref node)

{
  Ref *pRVar1;
  ulong uVar2;
  Value *this_00;
  char *s;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  emit(this,"break");
  pRVar1 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
  uVar2 = cashew::Ref::operator!(pRVar1);
  if ((uVar2 & 1) == 0) {
    emit(this,' ');
    pRVar1 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
    this_00 = Ref::operator->(pRVar1);
    s = Value::getCString(this_00);
    emit(this,s);
  }
  return;
}

Assistant:

void printBreak(Ref node) {
    emit("break");
    if (!!node[1]) {
      emit(' ');
      emit(node[1]->getCString());
    }
  }